

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_gzip.c
# Opt level: O2

int drive_compressor(archive_write_filter *f,private_data_conflict9 *data,int flush,void *src,
                    size_t length)

{
  ZSTD_outBuffer *pZVar1;
  anon_enum_32 aVar2;
  size_t sVar3;
  archive *a;
  int iVar4;
  long lVar5;
  undefined8 uVar6;
  ulong uVar7;
  ulong uVar8;
  size_t sVar9;
  ZSTD_inBuffer in;
  
  in.pos = 0;
  pZVar1 = &data->out;
  sVar9 = (data->out).pos;
  in.src = src;
  in.size = length;
  do {
    sVar3 = in.pos;
    aVar2 = data->state;
    if (aVar2 == resetting) {
      ZSTD_CCtx_reset(data->cstream,1);
      data->cur_frame = data->cur_frame + 1;
      data->state = running;
      data->cur_frame_in = 0;
      data->cur_frame_out = 0;
    }
    else if (aVar2 == finishing) {
      lVar5 = ZSTD_endStream(data->cstream,pZVar1);
      iVar4 = ZSTD_isError(lVar5);
      if (iVar4 != 0) {
LAB_0014a184:
        a = f->archive;
        uVar6 = ZSTD_getErrorName(lVar5);
        archive_set_error(a,-1,"Zstd compression failed: %s",uVar6);
        return -0x1e;
      }
      if (lVar5 == 0) {
        data->state = resetting;
      }
    }
    else if (aVar2 == running) {
      if (in.pos == in.size) {
        return 0;
      }
      lVar5 = ZSTD_compressStream(data->cstream,pZVar1,&in);
      iVar4 = ZSTD_isError(lVar5);
      if (iVar4 != 0) goto LAB_0014a184;
    }
    data->total_in = data->total_in + (in.pos - sVar3);
    uVar7 = (in.pos - sVar3) + data->cur_frame_in;
    data->cur_frame_in = uVar7;
    sVar3 = (data->out).pos;
    uVar8 = (sVar3 - sVar9) + data->cur_frame_out;
    data->cur_frame_out = uVar8;
    if ((data->state == running) &&
       ((data->max_frame_in <= uVar7 || (data->max_frame_out <= uVar8)))) {
      data->state = finishing;
    }
    if ((sVar3 == (data->out).size) || (sVar9 = sVar3, flush != 0 && sVar3 != 0)) {
      iVar4 = __archive_write_filter(f->next_filter,pZVar1->dst,sVar3);
      if (iVar4 != 0) {
        return -0x1e;
      }
      (data->out).pos = 0;
      sVar9 = 0;
    }
  } while( true );
}

Assistant:

static int
drive_compressor(struct archive_write_filter *f,
    struct private_data *data, int finishing)
{
	int ret;

	for (;;) {
		if (data->stream.avail_out == 0) {
			ret = __archive_write_filter(f->next_filter,
			    data->compressed,
			    data->compressed_buffer_size);
			if (ret != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
			data->stream.next_out = data->compressed;
			data->stream.avail_out =
			    (uInt)data->compressed_buffer_size;
		}

		/* If there's nothing to do, we're done. */
		if (!finishing && data->stream.avail_in == 0)
			return (ARCHIVE_OK);

		ret = deflate(&(data->stream),
		    finishing ? Z_FINISH : Z_NO_FLUSH );

		switch (ret) {
		case Z_OK:
			/* In non-finishing case, check if compressor
			 * consumed everything */
			if (!finishing && data->stream.avail_in == 0)
				return (ARCHIVE_OK);
			/* In finishing case, this return always means
			 * there's more work */
			break;
		case Z_STREAM_END:
			/* This return can only occur in finishing case. */
			return (ARCHIVE_OK);
		default:
			/* Any other return value indicates an error. */
			archive_set_error(f->archive, ARCHIVE_ERRNO_MISC,
			    "GZip compression failed:"
			    " deflate() call returned status %d",
			    ret);
			return (ARCHIVE_FATAL);
		}
	}
}